

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

void __thiscall kj::Path::Path(Path *this,ArrayPtr<const_kj::StringPtr> parts)

{
  anon_class_1_0_00000001 local_41;
  Mapper<kj::ArrayPtr<const_kj::StringPtr>_&> local_40;
  Array<kj::String> local_38;
  Path *local_20;
  Path *this_local;
  ArrayPtr<const_kj::StringPtr> parts_local;
  
  parts_local.ptr = (StringPtr *)parts.size_;
  this_local = (Path *)parts.ptr;
  local_20 = this;
  _::Mapper<kj::ArrayPtr<const_kj::StringPtr>_&>::Mapper
            (&local_40,(ArrayPtr<const_kj::StringPtr> *)&this_local);
  _::Mapper<kj::ArrayPtr<const_kj::StringPtr>_&>::
  operator*<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_filesystem_c__:44:12)>
            (&local_38,&local_40,&local_41);
  Path(this,&local_38);
  Array<kj::String>::~Array(&local_38);
  return;
}

Assistant:

Path::Path(ArrayPtr<const StringPtr> parts)
    : Path(KJ_MAP(p, parts) { return heapString(p); }) {}